

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O3

void lts2::PerformTVL1OnImageFAST
               (Mat *anImage,Size *patchSize,LBDOperator *LBD,Mat *result,int iterations,
               float lambda,float patchMean)

{
  int iVar1;
  int iVar2;
  LBDOperator *LBD_00;
  _InputArray *p_Var3;
  undefined8 uVar4;
  int iVar5;
  int in_register_00000084;
  Size patchSize_00;
  pointer pKVar6;
  pointer pKVar7;
  float fVar8;
  float fVar9;
  Rect ROI;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> fastPoints;
  Mat ocount;
  Mat inputPatch;
  Mat resultPatch;
  Mat patchOnes;
  Mat target;
  Mat freak;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  undefined1 local_448 [16];
  pointer local_438;
  _OutputArray local_428;
  _InputArray local_410;
  LBDOperator *local_3f8;
  _InputArray local_3f0 [4];
  Size local_390;
  undefined8 local_388;
  undefined8 local_380;
  _InputArray local_378 [4];
  undefined1 local_318 [16];
  undefined1 local_308 [6] [16];
  Mat local_2a8 [96];
  Mat local_248 [152];
  Mat local_1b0 [96];
  Mat local_150 [96];
  double local_f0 [12];
  Mat local_90 [96];
  
  patchSize_00.height = in_register_00000084;
  patchSize_00.width = iterations;
  if ((*(uint *)anImage & 0xfff) != 5) {
    local_318._8_8_ = local_318._0_8_;
    local_318._0_8_ = local_308;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_318,"anImage.type() == CV_32F && anImage.channels() == 1","");
    uVar4 = cv::error(-0xd7,(string *)local_318,"PerformTVL1OnImageFAST",
                      "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                      ,0x1ff);
    if ((undefined1 (*) [16])local_318._0_8_ != local_308) {
      operator_delete((void *)local_318._0_8_,local_308[0]._0_8_ + 1);
    }
    _Unwind_Resume(uVar4);
  }
  local_448 = (undefined1  [16])0x0;
  local_438 = (pointer)0x0;
  ExtractFastKeypoints(anImage,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_448);
  local_380 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                       (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
  cv::Mat::create(result,&local_380,5);
  local_378[0].obj = local_318;
  local_308[0] = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_378[0].flags = -0x3efdfffa;
  local_378[0].sz = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)result,local_378);
  local_388 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                       (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
  local_308[0] = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  cv::Mat::Mat((Mat *)local_378,&local_388,5);
  local_390 = *patchSize;
  cv::Mat::ones(local_318,&local_390,5);
  local_3f8 = LBD;
  cv::Mat::Mat(local_150);
  (**(code **)(*(long *)local_318._0_8_ + 0x18))(local_318._0_8_,local_318,local_150,0xffffffff);
  cv::Mat::~Mat(local_248);
  cv::Mat::~Mat(local_2a8);
  cv::Mat::~Mat((Mat *)local_308);
  cv::Mat::Mat((Mat *)local_318);
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_1b0);
  if (local_448._0_8_ != local_448._8_8_) {
    iVar1 = patchSize->width;
    iVar2 = patchSize->height;
    pKVar6 = (pointer)local_448._8_8_;
    pKVar7 = (pointer)local_448._0_8_;
    do {
      fVar9 = *(float *)(pKVar7 + 4);
      fVar8 = rintf(*(float *)pKVar7);
      iVar5 = (int)fVar8 - iVar1 / 2;
      fVar9 = rintf(fVar9);
      local_454 = (int)fVar9 - iVar2 / 2;
      local_450 = patchSize->width;
      local_44c = patchSize->height;
      local_458 = iVar5;
      if ((((-1 < local_454) && (local_454 + local_44c <= *(int *)(anImage + 8))) && (-1 < iVar5))
         && (iVar5 + local_450 <= *(int *)(anImage + 0xc))) {
        cv::Mat::Mat((Mat *)local_f0,anImage,(Rect_ *)&local_458);
        LBD_00 = local_3f8;
        local_3f0[0].sz.width = 0;
        local_3f0[0].sz.height = 0;
        local_3f0[0].flags = 0x2010000;
        local_3f0[0].obj = local_318;
        cv::Mat::copyTo((_OutputArray *)local_f0);
        cv::Mat::~Mat((Mat *)local_f0);
        fVar9 = patchMean;
        if (patchMean < 0.0) {
          local_3f0[0].sz.width = 0;
          local_3f0[0].sz.height = 0;
          local_3f0[0].flags = 0x1010000;
          local_3f0[0].obj = local_318;
          cv::noArray();
          cv::mean((_InputArray *)local_f0,local_3f0);
          fVar9 = (float)local_f0[0];
        }
        (*(LBD_00->super_LinearOperator)._vptr_LinearOperator[2])(LBD_00,local_318,local_90);
        RealReconstructionWithTVL1(local_1b0,LBD_00,local_90,iterations,lambda,patchSize_00,fVar9);
        cv::Mat::Mat((Mat *)local_f0,result,(Rect_ *)&local_458);
        local_3f0[0].sz.width = 0;
        local_3f0[0].sz.height = 0;
        local_3f0[0].flags = 0x1010000;
        local_410.sz.width = 0;
        local_410.sz.height = 0;
        local_410.flags = 0x1010000;
        local_410.obj = local_1b0;
        local_428.super__InputArray.sz.width = 0;
        local_428.super__InputArray.sz.height = 0;
        local_428.super__InputArray.flags = -0x3dff0000;
        local_428.super__InputArray.obj = (_InputArray *)local_f0;
        local_3f0[0].obj = (_InputArray *)local_f0;
        p_Var3 = (_InputArray *)cv::noArray();
        cv::add(local_3f0,&local_410,&local_428,p_Var3,-1);
        cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_378,(Rect_ *)&local_458);
        cv::Mat::operator=((Mat *)local_f0,(Mat *)local_3f0);
        cv::Mat::~Mat((Mat *)local_3f0);
        local_3f0[0].sz.width = 0;
        local_3f0[0].sz.height = 0;
        local_3f0[0].flags = 0x1010000;
        local_410.sz.width = 0;
        local_410.sz.height = 0;
        local_410.flags = 0x1010000;
        local_410.obj = local_150;
        local_428.super__InputArray.sz.width = 0;
        local_428.super__InputArray.sz.height = 0;
        local_428.super__InputArray.flags = -0x3dff0000;
        local_428.super__InputArray.obj = (_InputArray *)local_f0;
        local_3f0[0].obj = (_InputArray *)local_f0;
        p_Var3 = (_InputArray *)cv::noArray();
        patchSize_00.width = -1;
        patchSize_00.height = 0;
        cv::add(local_3f0,&local_410,&local_428,p_Var3,-1);
        cv::Mat::~Mat((Mat *)local_f0);
        pKVar6 = (pointer)local_448._8_8_;
      }
      pKVar7 = pKVar7 + 0x1c;
    } while (pKVar7 != pKVar6);
  }
  finalize(result,(Mat *)local_378[0].sz);
  cv::Mat::~Mat(local_1b0);
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)local_318);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat((Mat *)local_378);
  if ((pointer)local_448._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_448._0_8_,(long)local_438 - local_448._0_8_);
  }
  return;
}

Assistant:

void lts2::PerformTVL1OnImageFAST(cv::Mat const &anImage, cv::Size patchSize,
                                 LBDOperator &LBD, cv::Mat &result, int iterations, float lambda, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Extract image FAST points
  std::vector<cv::KeyPoint> fastPoints;
  ExtractFastKeypoints(anImage, fastPoints);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  int const pradius_x = patchSize.width / 2;
  int const pradius_y = patchSize.height / 2;

  std::vector<cv::KeyPoint>::const_iterator p_fast;

  for (p_fast = fastPoints.begin(); p_fast != fastPoints.end(); ++p_fast)
  {
    int x = (int)rintf(p_fast->pt.x) - pradius_x;
    int y = (int)rintf(p_fast->pt.y) - pradius_y;

    cv::Rect ROI(x, y, patchSize.width, patchSize.height);
    if ( y < 0 || y+patchSize.height > anImage.rows ||
         x < 0 || x+patchSize.width > anImage.cols )
      continue;

    anImage(ROI).copyTo(inputPatch);
    float pmean = patchMean;
    if (pmean < 0.0)
    {
      cv::Scalar mean = cv::mean(inputPatch);
      pmean = (float)mean[0];
    }

    LBD.Apply(inputPatch, freak);
    lts2::RealReconstructionWithTVL1(resultPatch, LBD, freak, iterations,
                                    lambda, patchSize, pmean);

    cv::Mat target = result(ROI);
    target += resultPatch;

    target = ocount(ROI);
    target += patchOnes;
  }

  finalize(result, ocount);
}